

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O2

Rect __thiscall lunasvg::SVGCircleElement::updateShape(SVGCircleElement *this,Path *path)

{
  float rx;
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  Rect RVar4;
  LengthContext lengthContext;
  LengthContext local_28;
  
  local_28.m_units = UserSpaceOnUse;
  local_28.m_element = (SVGElement *)this;
  rx = LengthContext::valueForLength(&local_28,&this->m_r);
  if (rx <= 0.0) {
    fVar1 = 0.0;
    fVar2 = 0.0;
    uVar3 = 0;
  }
  else {
    fVar1 = LengthContext::valueForLength(&local_28,&this->m_cx);
    fVar2 = LengthContext::valueForLength(&local_28,&this->m_cy);
    Path::addEllipse(path,fVar1,fVar2,rx,rx);
    fVar1 = fVar1 - rx;
    fVar2 = fVar2 - rx;
    uVar3 = CONCAT44(rx + rx,rx + rx);
  }
  RVar4.y = fVar2;
  RVar4.x = fVar1;
  RVar4.w = (float)(int)uVar3;
  RVar4.h = (float)(int)((ulong)uVar3 >> 0x20);
  return RVar4;
}

Assistant:

Rect SVGCircleElement::updateShape(Path& path)
{
    LengthContext lengthContext(this);
    auto r = lengthContext.valueForLength(m_r);
    if(r <= 0.f) {
        return Rect::Empty;
    }

    auto cx = lengthContext.valueForLength(m_cx);
    auto cy = lengthContext.valueForLength(m_cy);
    path.addEllipse(cx, cy, r, r);
    return Rect(cx - r, cy - r, r + r, r + r);
}